

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void show_help(char *name)

{
  int iVar1;
  Fl_Help_Dialog *this;
  char *pcVar2;
  FILE *__stream;
  Fl_Shared_Image *pFVar3;
  Fl_PNG_Image *this_00;
  char *pcVar4;
  char helpname [2048];
  char acStack_818 [2056];
  
  if (help_dialog == (Fl_Help_Dialog *)0x0) {
    this = (Fl_Help_Dialog *)operator_new(0x321d8);
    Fl_Help_Dialog::Fl_Help_Dialog(this);
    help_dialog = this;
  }
  pcVar2 = getenv("FLTK_DOCDIR");
  pcVar4 = "/usr/local/share/doc/fltk";
  if (pcVar2 != (char *)0x0) {
    pcVar4 = pcVar2;
  }
  snprintf(acStack_818,0x800,"%s/%s",pcVar4,name);
  __stream = fopen64(acStack_818,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = strcmp(name,"fluid.html");
    if (iVar1 != 0) {
      iVar1 = strcmp(name,"license.html");
      if (iVar1 == 0) {
        pcVar4 = "http://www.fltk.org/doc-1.3/license.html";
      }
      else {
        iVar1 = strcmp(name,"index.html");
        if (iVar1 != 0) {
          snprintf(acStack_818,0x800,"http://www.fltk.org/%s",name);
          fl_open_uri(acStack_818,(char *)0x0,0);
          return;
        }
        pcVar4 = "http://www.fltk.org/doc-1.3/index.html";
      }
      fl_open_uri(pcVar4,(char *)0x0,0);
      return;
    }
    pFVar3 = Fl_Shared_Image::find("embedded:/fluid-org.png",0,0);
    if (pFVar3 == (Fl_Shared_Image *)0x0) {
      this_00 = (Fl_PNG_Image *)operator_new(0x40);
      Fl_PNG_Image::Fl_PNG_Image(this_00,"embedded:/fluid-org.png",fluid_org_png,0x6bbc);
    }
    Fl_Help_Dialog::value
              (help_dialog,
               "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\">\n<html><head><title>FLTK: Programming with FLUID</title></head><body>\n<h2>What is FLUID?</h2>\nThe Fast Light User Interface Designer, or FLUID, is a graphical editor that is used to produce FLTK source code. FLUID edits and saves its state in <code>.fl</code> files. These files are text, and you can (with care) edit them in a text editor, perhaps to get some special effects.<p>\nFLUID can \"compile\" the <code>.fl</code> file into a <code>.cxx</code> and a <code>.h</code> file. The <code>.cxx</code> file defines all the objects from the <code>.fl</code> file and the <code>.h</code> file declares all the global ones. FLUID also supports localization (Internationalization) of label strings using message files and the GNU gettext or POSIX catgets interfaces.<p>\nA simple program can be made by putting all your code (including a <code>main()</code> function) into the <code>.fl</code> file and thus making the <code>.cxx</code> file a single source file to compile. Most programs are more complex than this, so you write other <code>.cxx</code> files that call the FLUID functions. These <code>.cxx</code> files must <code>#include</code> the <code>.h</code> file or they can <code>#include</code> the <code>.cxx</code> file so it still appears to be a single source file.<p><img src=\"embedded:/fluid-org.png\"></p><p>More information is available online at <a href=\"http://www.fltk.org/doc-1.3/fluid.html\">http://www.fltk.org/</a></body></html>"
              );
  }
  else {
    fclose(__stream);
    Fl_Help_Dialog::load(help_dialog,acStack_818);
  }
  Fl_Help_Dialog::show(help_dialog);
  return;
}

Assistant:

void show_help(const char *name) {
  const char	*docdir;
  char		helpname[FL_PATH_MAX];

  if (!help_dialog) help_dialog = new Fl_Help_Dialog();

  if ((docdir = getenv("FLTK_DOCDIR")) == NULL) {
#ifdef __EMX__
    // Doesn't make sense to have a hardcoded fallback
    static char fltk_docdir[FL_PATH_MAX];

    strlcpy(fltk_docdir, __XOS2RedirRoot("/XFree86/lib/X11/fltk/doc"),
            sizeof(fltk_docdir));

    docdir = fltk_docdir;
#else
    docdir = FLTK_DOCDIR;
#endif // __EMX__
  }
  snprintf(helpname, sizeof(helpname), "%s/%s", docdir, name);

  // make sure that we can read the file
  FILE *f = fopen(helpname, "rb");
  if (f) {
    fclose(f);
    help_dialog->load(helpname);
  } else {
    // if we can not read the file, we display the canned version instead
    // or ask the native browser to open the page on www.fltk.org
    if (strcmp(name, "fluid.html")==0) {
      if (!Fl_Shared_Image::find("embedded:/fluid-org.png"))
        new Fl_PNG_Image("embedded:/fluid-org.png", fluid_org_png, sizeof(fluid_org_png));
      help_dialog->value
      (
       "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\">\n"
       "<html><head><title>FLTK: Programming with FLUID</title></head><body>\n"
       "<h2>What is FLUID?</h2>\n"
       "The Fast Light User Interface Designer, or FLUID, is a graphical editor "
       "that is used to produce FLTK source code. FLUID edits and saves its state "
       "in <code>.fl</code> files. These files are text, and you can (with care) "
       "edit them in a text editor, perhaps to get some special effects.<p>\n"
       "FLUID can \"compile\" the <code>.fl</code> file into a <code>.cxx</code> "
       "and a <code>.h</code> file. The <code>.cxx</code> file defines all the "
       "objects from the <code>.fl</code> file and the <code>.h</code> file "
       "declares all the global ones. FLUID also supports localization "
       "(Internationalization) of label strings using message files and the GNU "
       "gettext or POSIX catgets interfaces.<p>\n"
       "A simple program can be made by putting all your code (including a <code>"
       "main()</code> function) into the <code>.fl</code> file and thus making the "
       "<code>.cxx</code> file a single source file to compile. Most programs are "
       "more complex than this, so you write other <code>.cxx</code> files that "
       "call the FLUID functions. These <code>.cxx</code> files must <code>"
       "#include</code> the <code>.h</code> file or they can <code>#include</code> "
       "the <code>.cxx</code> file so it still appears to be a single source file.<p>"
       "<img src=\"embedded:/fluid-org.png\"></p>"
       "<p>More information is available online at <a href="
       "\"http://www.fltk.org/doc-1.3/fluid.html\">http://www.fltk.org/</a>"
       "</body></html>"
       );
    } else if (strcmp(name, "license.html")==0) {
      fl_open_uri("http://www.fltk.org/doc-1.3/license.html");
      return;
    } else if (strcmp(name, "index.html")==0) {
      fl_open_uri("http://www.fltk.org/doc-1.3/index.html");
      return;
    } else {
      snprintf(helpname, sizeof(helpname), "http://www.fltk.org/%s", name);
      fl_open_uri(helpname);
      return;
    }
  }
  help_dialog->show();
}